

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O3

Vec_Int_t * Bmc_ManBCoreReadPivots(char *pName)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Int_t *p;
  int *piVar2;
  FILE *__stream;
  int Num;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  __stream = fopen(pName,"r");
  iVar1 = __isoc99_fscanf(__stream,"%d",(long)&uStack_28 + 4);
  if (iVar1 == 1) {
    do {
      Vec_IntPush(p,uStack_28._4_4_);
      iVar1 = __isoc99_fscanf(__stream,"%d",(long)&uStack_28 + 4);
    } while (iVar1 == 1);
  }
  fclose(__stream);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect pivot variables.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Bmc_ManBCoreReadPivots( char * pName )
{
    int Num;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    FILE * pFile = fopen( pName, "r" );
    while ( fscanf( pFile, "%d", &Num ) == 1 )
        Vec_IntPush( vPivots, Num );
    fclose( pFile );
    return vPivots;
}